

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int gmfgetreferencestringf77_(int64_t *MshIdx,int *kwd,int *idx,char *str,int siz)

{
  int iVar1;
  char *__dest;
  
  __dest = (char *)malloc((long)(siz + 1));
  if (__dest == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    strncpy(__dest,str,(long)siz);
    __dest[siz] = '\0';
    iVar1 = GmfGetLin(*MshIdx,199,kwd,idx,__dest);
    free(__dest);
  }
  return iVar1;
}

Assistant:

int APIF77(gmfgetreferencestringf77)(int64_t *MshIdx, int *kwd, int *idx, char *str, int siz)
{
   int   ret;
   char *tmp = malloc(siz+1);

   // Allocate a string with one extra character to store the trailing 0
   if(!tmp)
      return(0);

   // Copy the Fortran string into the C string and add a trailing 0
   strncpy(tmp, str, siz);
   tmp[ siz ] = 0;

   // Now call the C procedure a free the temporary string
   ret = GmfGetLin(*MshIdx, GmfReferenceStrings, kwd, idx, tmp);
   free(tmp);

   return(ret);
}